

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::get_dynamic_spec<fmt::v11::context>
              (arg_id_kind kind,arg_ref<char> *ref,context *ctx)

{
  undefined1 x [16];
  undefined1 value_00 [16];
  undefined1 x_00 [16];
  undefined1 value_01 [16];
  string_view name;
  custom_value<fmt::v11::context> custom;
  ulong uVar1;
  bool bVar2;
  int value_02;
  make_unsigned_t<int> mVar3;
  unkbyte10 in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea2;
  dynamic_spec_getter local_111;
  ulong local_110;
  unsigned_long_long value;
  size_t local_100;
  undefined1 auStack_f8 [8];
  format_arg arg;
  context *ctx_local;
  arg_ref<char> *ref_local;
  arg_id_kind kind_local;
  custom_value<fmt::v11::context> local_a8;
  basic_string_view<char> local_98;
  uint128_opt *local_88;
  uint128_opt *local_78;
  int128_opt *local_58;
  int128_opt *local_48;
  dynamic_spec_getter *local_20;
  string_value<char> *local_18;
  ulong local_10;
  
  ref_local._0_4_ = kind;
  if (kind == none) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0xdd1,"");
  }
  if (kind == index) {
    v11::context::arg((format_arg *)auStack_f8,ctx,ref->index);
  }
  else {
    value = (unsigned_long_long)(ref->name).data_;
    local_100 = (ref->name).size_;
    name.data_ = *(char **)ref;
    name.size_ = *(size_t *)((long)ref + 8);
    v11::context::arg((format_arg *)auStack_f8,ctx,name);
  }
  bVar2 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_f8);
  if (!bVar2) {
    report_error("argument not found");
  }
  local_18 = (string_value<char> *)auStack_f8;
  local_20 = &local_111;
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 0:
  default:
    monostate::monostate((monostate *)((long)&ref_local + 7));
    local_10 = dynamic_spec_getter::operator()<fmt::v11::monostate,_0>(&local_111);
    break;
  case 1:
    local_10 = dynamic_spec_getter::operator()<int,_0>(&local_111,auStack_f8._0_4_);
    break;
  case 2:
    local_10 = dynamic_spec_getter::operator()<unsigned_int,_0>(&local_111,auStack_f8._0_4_);
    break;
  case 3:
    local_10 = dynamic_spec_getter::operator()<long_long,_0>
                         (&local_111,CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_));
    break;
  case 4:
    local_10 = dynamic_spec_getter::operator()<unsigned_long_long,_0>
                         (&local_111,CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_));
    break;
  case 5:
    x._10_6_ = in_stack_fffffffffffffea2;
    x._0_10_ = in_stack_fffffffffffffe98;
    local_58 = map((int128_opt *)CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_),(int128_opt)x);
    value_00._10_6_ = in_stack_fffffffffffffea2;
    value_00._0_10_ = in_stack_fffffffffffffe98;
    local_48 = local_58;
    local_10 = dynamic_spec_getter::operator()<__int128,_0>(&local_111,(__int128)value_00);
    break;
  case 6:
    x_00._10_6_ = in_stack_fffffffffffffea2;
    x_00._0_10_ = in_stack_fffffffffffffe98;
    local_88 = map((uint128_opt *)CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_),(uint128_opt)x_00);
    value_01._10_6_ = in_stack_fffffffffffffea2;
    value_01._0_10_ = in_stack_fffffffffffffe98;
    local_78 = local_88;
    local_10 = dynamic_spec_getter::operator()<unsigned___int128,_0>
                         (&local_111,(unsigned___int128)value_01);
    break;
  case 7:
    local_10 = dynamic_spec_getter::operator()<bool,_0>(&local_111,(bool)(auStack_f8[0] & 1));
    break;
  case 8:
    local_10 = dynamic_spec_getter::operator()<char,_0>(&local_111,auStack_f8[0]);
    break;
  case 9:
    local_10 = dynamic_spec_getter::operator()<float,_0>(&local_111,(float)auStack_f8._0_4_);
    break;
  case 10:
    local_10 = dynamic_spec_getter::operator()<double,_0>
                         (&local_111,(double)CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_));
    break;
  case 0xb:
    local_10 = dynamic_spec_getter::operator()<long_double,_0>
                         (&local_111,
                          (longdouble)
                          CONCAT28(arg.value_.field_0.int_value._0_2_,
                                   CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_)));
    break;
  case 0xc:
    local_10 = dynamic_spec_getter::operator()<const_char_*,_0>
                         (&local_111,(char *)CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_));
    break;
  case 0xd:
    local_98 = string_value<char>::str(local_18);
    local_10 = dynamic_spec_getter::operator()<fmt::v11::basic_string_view<char>,_0>
                         (&local_111,local_98);
    break;
  case 0xe:
    local_10 = dynamic_spec_getter::operator()<const_void_*,_0>
                         (&local_111,(void *)CONCAT44(auStack_f8._4_4_,auStack_f8._0_4_));
    break;
  case 0xf:
    custom.value._4_4_ = auStack_f8._4_4_;
    custom.value._0_4_ = auStack_f8._0_4_;
    custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
    custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
    basic_format_arg<fmt::v11::context>::handle::handle((handle *)&local_a8,custom);
    local_10 = dynamic_spec_getter::
               operator()<fmt::v11::basic_format_arg<fmt::v11::context>::handle,_0>
                         (&local_111,(handle)local_a8);
  }
  uVar1 = local_10;
  local_110 = local_10;
  value_02 = max_value<int>();
  mVar3 = to_unsigned<int>(value_02);
  if (uVar1 <= mVar3) {
    return (int)local_110;
  }
  report_error("width/precision is out of range");
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(
    arg_id_kind kind, const arg_ref<typename Context::char_type>& ref,
    Context& ctx) {
  FMT_ASSERT(kind != arg_id_kind::none, "");
  auto arg =
      kind == arg_id_kind::index ? ctx.arg(ref.index) : ctx.arg(ref.name);
  if (!arg) report_error("argument not found");
  unsigned long long value = arg.visit(dynamic_spec_getter());
  if (value > to_unsigned(max_value<int>()))
    report_error("width/precision is out of range");
  return static_cast<int>(value);
}